

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_iterate
                (bitset_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  int iVar1;
  ulong uVar2;
  undefined8 in_RCX;
  code *in_RDX;
  int in_ESI;
  long in_RDI;
  int r;
  uint64_t t;
  uint64_t w;
  int32_t i;
  ulong local_38;
  int local_2c;
  int local_14;
  
  local_2c = 0;
  local_14 = in_ESI;
  do {
    if (0x3ff < local_2c) {
      return true;
    }
    for (local_38 = *(ulong *)(*(long *)(in_RDI + 8) + (long)local_2c * 8); local_38 != 0;
        local_38 = local_38 & (local_38 ^ 0xffffffffffffffff) + 1 ^ local_38) {
      iVar1 = roaring_trailing_zeroes(local_38);
      uVar2 = (*in_RDX)(iVar1 + local_14,in_RCX);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    local_14 = local_14 + 0x40;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool bitset_container_iterate(const bitset_container_t *cont, uint32_t base, roaring_iterator iterator, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = roaring_trailing_zeroes(w);
      if(!iterator(r + base, ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}